

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack4_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0xf;
  out[1] = *in >> 4 & 0xf;
  out[2] = *in >> 8 & 0xf;
  out[3] = *in >> 0xc & 0xf;
  out[4] = *in >> 0x10 & 0xf;
  out[5] = *in >> 0x14 & 0xf;
  out[6] = *in >> 0x18 & 0xf;
  out[7] = *in >> 0x1c;
  puVar1 = in + 1;
  out[8] = *puVar1 & 0xf;
  out[9] = *puVar1 >> 4 & 0xf;
  out[10] = *puVar1 >> 8 & 0xf;
  out[0xb] = *puVar1 >> 0xc & 0xf;
  out[0xc] = *puVar1 >> 0x10 & 0xf;
  out[0xd] = *puVar1 >> 0x14 & 0xf;
  out[0xe] = *puVar1 >> 0x18 & 0xf;
  out[0xf] = *puVar1 >> 0x1c;
  puVar1 = in + 2;
  out[0x10] = *puVar1 & 0xf;
  out[0x11] = *puVar1 >> 4 & 0xf;
  out[0x12] = *puVar1 >> 8 & 0xf;
  out[0x13] = *puVar1 >> 0xc & 0xf;
  out[0x14] = *puVar1 >> 0x10 & 0xf;
  out[0x15] = *puVar1 >> 0x14 & 0xf;
  out[0x16] = *puVar1 >> 0x18 & 0xf;
  out[0x17] = *puVar1 >> 0x1c;
  puVar1 = in + 3;
  out[0x18] = *puVar1 & 0xf;
  out[0x19] = *puVar1 >> 4 & 0xf;
  out[0x1a] = *puVar1 >> 8 & 0xf;
  out[0x1b] = *puVar1 >> 0xc & 0xf;
  out[0x1c] = *puVar1 >> 0x10 & 0xf;
  out[0x1d] = *puVar1 >> 0x14 & 0xf;
  out[0x1e] = *puVar1 >> 0x18 & 0xf;
  out[0x1f] = *puVar1 >> 0x1c;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack4_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;

  return in;
}